

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall QOpenGLShaderPrivate::~QOpenGLShaderPrivate(QOpenGLShaderPrivate *this)

{
  *(undefined ***)this = &PTR__QOpenGLShaderPrivate_001a0fd8;
  operator_delete(this->glfuncs,8);
  if (this->shaderGuard != (QOpenGLSharedResourceGuard *)0x0) {
    QOpenGLSharedResource::free();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->log).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QOpenGLShaderPrivate::~QOpenGLShaderPrivate()
{
    delete glfuncs;
    if (shaderGuard)
        shaderGuard->free();
}